

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_typed_tests.hpp
# Opt level: O3

void __thiscall
iutest::detail::
TypeParamTestInstance<test::string_assertion_test::iu_StrCaseTest_x_iutest_x_EqNull_Test,_iutest::detail::VariadicTypeList<char,_wchar_t>_>
::EachTest<iutest::detail::VariadicTypeList<char,_wchar_t>,_void>::AddTest
          (EachTest<iutest::detail::VariadicTypeList<char,_wchar_t>,_void> *this)

{
  TestSuite *pTVar1;
  UnitTest *pUVar2;
  
  pUVar2 = UnitTest::instance();
  pTVar1 = (this->m_mediator).super_iuITestSuiteMediator.m_test_suite;
  (pUVar2->super_UnitTestImpl).m_total_test_num = (pUVar2->super_UnitTestImpl).m_total_test_num + 1;
  TestSuite::push_back(pTVar1,&this->m_info);
  pUVar2 = UnitTest::instance();
  pTVar1 = (this->m_next).m_mediator.super_iuITestSuiteMediator.m_test_suite;
  (pUVar2->super_UnitTestImpl).m_total_test_num = (pUVar2->super_UnitTestImpl).m_total_test_num + 1;
  TestSuite::push_back(pTVar1,&(this->m_next).m_info);
  return;
}

Assistant:

void AddTest()
        {
            // 順番通りになるように前から登録
            UnitTest::instance().AddTestInfo(m_mediator.ptr(), &m_info);
            m_next.AddTest();
        }